

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool S2Loop::HasCrossingRelation(S2Loop *a,S2Loop *b,LoopRelation *relation)

{
  const_reference pvVar1;
  const_reference b_clipped;
  RangeIterator_conflict *target;
  RangeIterator_conflict *this;
  bool bVar2;
  bool bVar3;
  RangeIterator_conflict bi;
  RangeIterator_conflict ai;
  LoopCrosser ab;
  LoopCrosser ba;
  RangeIterator_conflict local_2e0;
  RangeIterator_conflict local_290;
  LoopCrosser local_240;
  LoopCrosser local_138;
  
  RangeIterator::RangeIterator((RangeIterator *)&local_290,&a->index_);
  RangeIterator::RangeIterator((RangeIterator *)&local_2e0,&b->index_);
  LoopCrosser::LoopCrosser(&local_240,a,b,relation,false);
  LoopCrosser::LoopCrosser(&local_138,b,a,relation,true);
  bVar2 = (local_2e0.it_.super_IteratorBase.id_.id_ & local_290.it_.super_IteratorBase.id_.id_) !=
          0xffffffffffffffff;
  if (bVar2) {
    do {
      target = &local_2e0;
      this = &local_290;
      if ((local_290.range_max_.id_ < local_2e0.range_min_.id_) ||
         (target = &local_290, this = &local_2e0,
         local_2e0.range_max_.id_ < local_290.range_min_.id_)) {
        RangeIterator::SeekTo((RangeIterator *)this,target);
      }
      else {
        bVar3 = (long)((-local_290.it_.super_IteratorBase.id_.id_ &
                       local_290.it_.super_IteratorBase.id_.id_) -
                      (-local_2e0.it_.super_IteratorBase.id_.id_ &
                      local_2e0.it_.super_IteratorBase.id_.id_)) < 0;
        if ((-local_290.it_.super_IteratorBase.id_.id_ & local_290.it_.super_IteratorBase.id_.id_)
            == (-local_2e0.it_.super_IteratorBase.id_.id_ & local_2e0.it_.super_IteratorBase.id_.id_
               ) || bVar3) {
          if (!bVar3) {
            pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                     operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                 *)local_290.it_.super_IteratorBase.cell_._M_b._M_p,0);
            if ((local_240.a_crossing_target_ != (*(uint *)&pvVar1->field_0x4 & 1)) ||
               (pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                         operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                     *)local_2e0.it_.super_IteratorBase.cell_._M_b._M_p,0),
               local_240.b_crossing_target_ != (*(uint *)&pvVar1->field_0x4 & 1))) {
              pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                       operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                   *)local_290.it_.super_IteratorBase.cell_._M_b._M_p,0);
              if ((1 < *(uint *)&pvVar1->field_0x4) &&
                 (pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                           ::operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                         *)local_2e0.it_.super_IteratorBase.cell_._M_b._M_p,0),
                 1 < *(uint *)&pvVar1->field_0x4)) {
                pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                         operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                     *)local_290.it_.super_IteratorBase.cell_._M_b._M_p,0);
                b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                            ::operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                          *)local_2e0.it_.super_IteratorBase.cell_._M_b._M_p,0);
                bVar3 = LoopCrosser::CellCrossesCell(&local_240,pvVar1,b_clipped);
                if (bVar3) break;
              }
              MutableS2ShapeIndex::Iterator::Next(&local_290.it_);
              local_290.range_max_.id_ =
                   local_290.it_.super_IteratorBase.id_.id_ - 1 |
                   local_290.it_.super_IteratorBase.id_.id_;
              local_290.range_min_.id_ =
                   local_290.it_.super_IteratorBase.id_.id_ -
                   (~local_290.it_.super_IteratorBase.id_.id_ &
                   local_290.it_.super_IteratorBase.id_.id_ - 1);
              MutableS2ShapeIndex::Iterator::Next(&local_2e0.it_);
              local_2e0.range_max_.id_ =
                   local_2e0.it_.super_IteratorBase.id_.id_ - 1 |
                   local_2e0.it_.super_IteratorBase.id_.id_;
              local_2e0.range_min_.id_ =
                   local_2e0.it_.super_IteratorBase.id_.id_ -
                   (~local_2e0.it_.super_IteratorBase.id_.id_ &
                   local_2e0.it_.super_IteratorBase.id_.id_ - 1);
              goto LAB_00200a32;
            }
            break;
          }
          bVar3 = LoopCrosser::HasCrossingRelation(&local_138,&local_2e0,&local_290);
        }
        else {
          bVar3 = LoopCrosser::HasCrossingRelation(&local_240,&local_290,&local_2e0);
        }
        if (bVar3 != false) break;
      }
LAB_00200a32:
      bVar2 = (local_2e0.it_.super_IteratorBase.id_.id_ & local_290.it_.super_IteratorBase.id_.id_)
              != 0xffffffffffffffff;
    } while (bVar2);
  }
  if (local_138.b_cells_.
      super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.b_cells_.
                    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_138.b_query_);
  if (local_240.b_cells_.
      super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.b_cells_.
                    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_240.b_query_);
  return bVar2;
}

Assistant:

bool S2Loop::HasCrossingRelation(const S2Loop& a, const S2Loop& b,
                                            LoopRelation* relation) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.
  RangeIterator ai(&a.index_), bi(&b.index_);
  LoopCrosser ab(a, b, relation, false);  // Tests edges of A against B
  LoopCrosser ba(b, a, relation, true);   // Tests edges of B against A
  while (!ai.Done() || !bi.Done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (ab.HasCrossingRelation(&ai, &bi)) return true;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (ba.HasCrossingRelation(&bi, &ai)) return true;
      } else {
        // The A and B cells are the same.  Since the two cells have the same
        // center point P, check whether P satisfies the crossing targets.
        if (ai.contains_center() == ab.a_crossing_target() &&
            bi.contains_center() == ab.b_crossing_target()) {
          return true;
        }
        // Otherwise test all the edge crossings directly.
        if (ai.num_edges() > 0 && bi.num_edges() > 0 &&
            ab.CellCrossesCell(ai.clipped(), bi.clipped())) {
          return true;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return false;
}